

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> __thiscall
spvtools::opt::InstrumentPass::StartFunction
          (InstrumentPass *this,uint32_t func_id,Type *return_type,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *param_types)

{
  _Head_base<0UL,_spvtools::opt::Function_*,_false> _Var1;
  TypeManager *this_00;
  Function *type;
  DefUseManager *this_01;
  long lVar2;
  undefined4 in_register_00000034;
  InstrumentPass *this_02;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *in_R8;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint local_118;
  uint32_t func_id_local;
  Type *local_110;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_108;
  uint32_t local_fc;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  SmallVector<unsigned_int,_2UL> local_e0;
  SmallVector<unsigned_int,_2UL> local_b8;
  undefined1 local_90 [48];
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this_02 = (InstrumentPass *)CONCAT44(in_register_00000034,func_id);
  func_id_local = (uint32_t)return_type;
  local_108._M_head_impl = (Function *)this;
  this_00 = IRContext::get_type_mgr((this_02->super_Pass).context_);
  local_110 = (Type *)param_types;
  type = GetFunction(this_02,(Type *)param_types,in_R8);
  local_118 = 0;
  init_list._M_len = 1;
  init_list._M_array = &local_118;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list);
  local_90._0_4_ = 6;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_90 + 8),&local_b8);
  local_fc = analysis::TypeManager::GetId(this_00,&type->super_Type);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_fc;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_00);
  local_60 = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_e0);
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&operands,
             local_90,&stack0xffffffffffffffd0);
  lVar2 = 0x38;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_90 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
  local_b8._vptr_SmallVector = (_func_int **)(this_02->super_Pass).context_;
  local_e0._vptr_SmallVector._0_4_ = 0x36;
  local_118 = analysis::TypeManager::GetId(this_00,local_110);
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,unsigned_int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>const&>
            ((spvtools *)local_90,(IRContext **)&local_b8,(Op *)&local_e0,&local_118,&func_id_local,
             &operands);
  this_01 = Pass::get_def_use_mgr((Pass *)this_02);
  analysis::DefUseManager::AnalyzeInstDefUse
            (this_01,(Instruction *)CONCAT44(local_90._4_4_,local_90._0_4_));
  _Var1._M_head_impl = local_108._M_head_impl;
  MakeUnique<spvtools::opt::Function,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)local_108._M_head_impl,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)local_90);
  if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return (__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
            )_Var1._M_head_impl;
}

Assistant:

std::unique_ptr<Function> InstrumentPass::StartFunction(
    uint32_t func_id, const analysis::Type* return_type,
    const std::vector<const analysis::Type*>& param_types) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Function* func_type = GetFunction(return_type, param_types);

  const std::vector<Operand> operands{
      {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
       {uint32_t(spv::FunctionControlMask::MaskNone)}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_mgr->GetId(func_type)}},
  };
  auto func_inst =
      MakeUnique<Instruction>(context(), spv::Op::OpFunction,
                              type_mgr->GetId(return_type), func_id, operands);
  get_def_use_mgr()->AnalyzeInstDefUse(&*func_inst);
  return MakeUnique<Function>(std::move(func_inst));
}